

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

void __thiscall
charls::jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::encoder_strategy>
::encode_lines(jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::encoder_strategy>
               *this)

{
  value_type vVar1;
  uint uVar2;
  pointer __n;
  uint uVar3;
  coding_parameters *pcVar4;
  frame_info *pfVar5;
  reference pvVar6;
  reference pvVar7;
  pointer local_88;
  pointer local_78;
  size_t component;
  uint32_t line;
  vector<int,_std::allocator<int>_> run_index;
  allocator<unsigned_short> local_39;
  undefined1 local_38 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> line_buffer;
  size_t component_count;
  uint32_t pixel_stride;
  jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::encoder_strategy>
  *this_local;
  
  uVar3 = this->width_ + 4;
  pcVar4 = parameters(this);
  if (pcVar4->interleave_mode == Line) {
    pfVar5 = frame_info(this);
    local_88 = (pointer)(long)pfVar5->component_count;
  }
  else {
    local_88 = (pointer)0x1;
  }
  line_buffer.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_88;
  std::allocator<unsigned_short>::allocator(&local_39);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_38,
             (long)local_88 * (ulong)uVar3 * 2,&local_39);
  std::allocator<unsigned_short>::~allocator(&local_39);
  __n = line_buffer.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  std::allocator<int>::allocator((allocator<int> *)((long)&component + 7));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&line,(size_type)__n,
             (allocator<int> *)((long)&component + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&component + 7));
  component._0_4_ = 0;
  while( true ) {
    uVar2 = (uint)component;
    pfVar5 = frame_info(this);
    if (pfVar5->height <= uVar2) break;
    pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_38,1);
    this->previous_line_ = pvVar6;
    pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_38,
                        (long)line_buffer.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage * (ulong)uVar3 + 1);
    this->current_line_ = pvVar6;
    if (((uint)component & 1) == 1) {
      std::swap<unsigned_short*>(&this->previous_line_,&this->current_line_);
    }
    encoder_strategy::on_line_begin
              (&this->super_encoder_strategy,this->current_line_,(ulong)this->width_,(ulong)uVar3);
    for (local_78 = (pointer)0x0;
        local_78 <
        line_buffer.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage; local_78 = (pointer)((long)local_78 + 1)) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&line,(size_type)local_78);
      this->run_index_ = *pvVar7;
      this->previous_line_[this->width_] = this->previous_line_[this->width_ - 1];
      this->current_line_[-1] = *this->previous_line_;
      do_line(this,(sample_type *)0x0);
      vVar1 = this->run_index_;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&line,(size_type)local_78);
      *pvVar7 = vVar1;
      this->previous_line_ = this->previous_line_ + uVar3;
      this->current_line_ = this->current_line_ + uVar3;
    }
    component._0_4_ = (uint)component + 1;
  }
  encoder_strategy::end_scan(&this->super_encoder_strategy);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&line);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_38);
  return;
}

Assistant:

void encode_lines()
    {
        const uint32_t pixel_stride{width_ + 4U};
        const size_t component_count{
            parameters().interleave_mode == interleave_mode::line ? static_cast<size_t>(frame_info().component_count) : 1U};

        std::vector<pixel_type> line_buffer(component_count * pixel_stride * 2);
        std::vector<int32_t> run_index(component_count);

        for (uint32_t line{}; line < frame_info().height; ++line)
        {
            previous_line_ = &line_buffer[1];
            current_line_ = &line_buffer[1 + static_cast<size_t>(component_count) * pixel_stride];
            if ((line & 1) == 1)
            {
                std::swap(previous_line_, current_line_);
            }

            Strategy::on_line_begin(current_line_, width_, pixel_stride);

            for (size_t component{}; component < component_count; ++component)
            {
                run_index_ = run_index[component];

                // initialize edge pixels used for prediction
                previous_line_[width_] = previous_line_[width_ - 1];
                current_line_[-1] = previous_line_[0];
                do_line(static_cast<pixel_type*>(nullptr)); // dummy argument for overload resolution

                run_index[component] = run_index_;
                previous_line_ += pixel_stride;
                current_line_ += pixel_stride;
            }
        }

        Strategy::end_scan();
    }